

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O1

void * OPENSSL_calloc(size_t num,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  size_t size_00;
  
  if ((size == 0) ||
     (auVar1._8_8_ = 0, auVar1._0_8_ = size, auVar2._8_8_ = 0, auVar2._0_8_ = num,
     SUB168(auVar1 * auVar2,8) == 0)) {
    size_00 = size * num;
    pvVar3 = OPENSSL_malloc(size_00);
    if (size_00 != 0 && pvVar3 != (void *)0x0) {
      pvVar3 = memset(pvVar3,0,size_00);
      return pvVar3;
    }
  }
  else {
    pvVar3 = (void *)0x0;
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem.cc"
                  ,0xe7);
  }
  return pvVar3;
}

Assistant:

void *OPENSSL_calloc(size_t num, size_t size) {
  if (size != 0 && num > SIZE_MAX / size) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    return NULL;
  }

  return OPENSSL_zalloc(num * size);
}